

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O1

void __thiscall
amrex::BndryData::setBoundCond(BndryData *this,Orientation _face,int _n,int _comp,BoundCond *_bcn)

{
  int iVar1;
  
  iVar1 = FabArrayBase::localindex(&(this->bcond).super_FabArrayBase,_n);
  *(int *)(*(long *)(*(long *)&(this->bcond).m_data.
                               super_vector<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar1].
                               super_vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>
                    + (long)_face.val * 0x18) + (long)_comp * 4) = _bcn->bctype;
  return;
}

Assistant:

void
BndryData::setBoundCond (Orientation     _face,
                         int              _n,
                         int              _comp,
                         const BoundCond& _bcn) noexcept
{
    bcond[_n][_face][_comp] = _bcn;
}